

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

Node * __thiscall Builder::AddTarget(Builder *this,string *name,string *err)

{
  State *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  StringPiece local_40;
  Builder *local_30;
  Node *node;
  string *err_local;
  string *name_local;
  Builder *this_local;
  
  this_00 = this->state_;
  node = (Node *)err;
  err_local = name;
  name_local = (string *)this;
  StringPiece::StringPiece(&local_40,name);
  local_30 = (Builder *)State::LookupNode(this_00,local_40);
  if (local_30 == (Builder *)0x0) {
    std::operator+(&local_80,"unknown target: \'",err_local);
    std::operator+(&local_60,&local_80,"\'");
    std::__cxx11::string::operator=((string *)node,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    this_local = (Builder *)0x0;
  }
  else {
    bVar1 = AddTarget(this,(Node *)local_30,&node->path_);
    if (bVar1) {
      this_local = local_30;
    }
    else {
      this_local = (Builder *)0x0;
    }
  }
  return (Node *)this_local;
}

Assistant:

Node* Builder::AddTarget(const string& name, string* err) {
  Node* node = state_->LookupNode(name);
  if (!node) {
    *err = "unknown target: '" + name + "'";
    return NULL;
  }
  if (!AddTarget(node, err))
    return NULL;
  return node;
}